

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

acmod_id_t
acmod_set_add_tri(acmod_set_t *acmod_set,acmod_id_t base,acmod_id_t left_context,
                 acmod_id_t right_context,word_posn_t posn,char **attrib)

{
  cell_id_t tri_id;
  acmod_t *paVar1;
  uint uVar2;
  itree_t **ppiVar3;
  itree_t *piVar4;
  char **ppcVar5;
  acmod_t *multi;
  uint32 i;
  uint32 n_ci;
  uint32 addr;
  acmod_id_t new;
  char **attrib_local;
  word_posn_t posn_local;
  acmod_id_t right_context_local;
  acmod_id_t left_context_local;
  acmod_id_t base_local;
  acmod_set_t *acmod_set_local;
  
  if (acmod_set->n_multi == acmod_set->max_n_multi) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
            ,0x143,
            "Current acmod_set implementation requires the \'n_tri_hint\' to be not less than the number to be added.\n"
           );
    exit(1);
  }
  paVar1 = acmod_set->multi;
  uVar2 = acmod_set->n_ci;
  if (acmod_set->multi_idx == (itree_t **)0x0) {
    ppiVar3 = (itree_t **)
              __ckd_calloc__((ulong)uVar2,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                             ,0x150);
    acmod_set->multi_idx = ppiVar3;
    for (multi._0_4_ = 0; (uint)multi < uVar2; multi._0_4_ = (uint)multi + 1) {
      piVar4 = itree_new(uVar2 * uVar2 * 8);
      acmod_set->multi_idx[(uint)multi] = piVar4;
    }
  }
  if (0xff < base) {
    __assert_fail("base < 256",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                  ,0x169,
                  "acmod_id_t acmod_set_add_tri(acmod_set_t *, acmod_id_t, acmod_id_t, acmod_id_t, word_posn_t, const char **)"
                 );
  }
  if (0xff < left_context) {
    __assert_fail("left_context < 256",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                  ,0x16a,
                  "acmod_id_t acmod_set_add_tri(acmod_set_t *, acmod_id_t, acmod_id_t, acmod_id_t, word_posn_t, const char **)"
                 );
  }
  if (0xff < right_context) {
    __assert_fail("right_context < 256",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                  ,0x16b,
                  "acmod_id_t acmod_set_add_tri(acmod_set_t *, acmod_id_t, acmod_id_t, acmod_id_t, word_posn_t, const char **)"
                 );
  }
  tri_id = acmod_set->next_id;
  itree_add_tri(acmod_set->multi_idx[base],left_context,right_context,posn,tri_id);
  uVar2 = tri_id - uVar2;
  acmod_set->next_id = acmod_set->next_id + 1;
  paVar1[uVar2].base = (ci_acmod_id_t)base;
  paVar1[uVar2].left_context = (ci_acmod_id_t)left_context;
  paVar1[uVar2].right_context = (ci_acmod_id_t)right_context;
  paVar1[uVar2].posn = posn;
  ppcVar5 = new_attrib(attrib);
  paVar1[uVar2].attrib = ppcVar5;
  acmod_set->n_multi = acmod_set->n_multi + 1;
  return tri_id;
}

Assistant:

acmod_id_t
acmod_set_add_tri(acmod_set_t *acmod_set,
		  acmod_id_t base,
		  acmod_id_t left_context,
		  acmod_id_t right_context,
		  word_posn_t posn,
		  const char **attrib)
{
    acmod_id_t new;
    uint32 addr;
    uint32 n_ci;
    uint32 i;
    acmod_t *multi;

    if (acmod_set->n_multi == acmod_set->max_n_multi) {
	E_FATAL("Current acmod_set implementation requires the 'n_tri_hint' to "
		"be not less than the number to be added.\n");
    }
    
    /* get the multi-phone list (e.g. di, tri, quad phones ) */
    multi = acmod_set->multi;

    n_ci = acmod_set->n_ci;

    if (acmod_set->multi_idx == NULL) {
	/* allocate space for multiphone -> acoustic model id
	 * index */

	acmod_set->multi_idx = ckd_calloc(n_ci,
					  sizeof(itree_t *));

	  /* HACK! In theory, n_ci * n_ci * N_WORD_POSN should be
	     enough to store all possible triphones.  However, in
	     practice, we have seen situation where, the number of
	     cells allocated in itree is bigger than n_ci * n_ci *
	     N_WORD_POSN.  This simply mean there might be something
	     wrong within the itree module.

	     One could follow this thread of discussion to further the
	     investigation at
	     http://sourceforge.net/forum/forum.php?thread_id=1541914&forum_id=5471
	     
	     The resource is checked in and could be found in test
	     bugcase1. This will solve the immediate the problem which
	     the user was suffering.  We should revisit this issue
	     later on.
	   */

	for (i = 0; i < n_ci; i++) {	  
	  acmod_set->multi_idx[i] = itree_new(n_ci * n_ci * N_WORD_POSN * 2); 
	  /*  acmod_set->multi_idx[i] = itree_new(n_ci * n_ci * N_WORD_POSN ); */
	}
    }
    
    assert(base < 256);
    assert(left_context < 256);
    assert(right_context < 256);

    new = acmod_set->next_id;

    /* adds an index cell for this triphone. */
    itree_add_tri(acmod_set->multi_idx[base],
		  left_context, right_context, posn,
		  new);
    
    /* multiphone list does not include CI acoustic models */
    addr = new - n_ci;
    
    /* get ready for next add if any */
    acmod_set->next_id++;

    multi[addr].base = base;
    multi[addr].left_context = left_context;
    multi[addr].right_context = right_context;
    multi[addr].posn = posn;
    multi[addr].attrib = new_attrib(attrib);

    acmod_set->n_multi++;

    return new;
}